

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dnrm2.c
# Opt level: O1

double dnrm2_(int *n,double *x,int *incx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  iVar1 = *n;
  iVar2 = *incx;
  dVar6 = 0.0;
  if (0 < iVar2 && 0 < (long)iVar1) {
    if (iVar1 == 1) {
      return ABS(*x);
    }
    lVar3 = ((long)iVar1 + -1) * (long)iVar2;
    if (lVar3 < 0) {
      dVar4 = 1.0;
    }
    else {
      dVar4 = 1.0;
      do {
        dVar5 = x[lVar3];
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          dVar5 = ABS(dVar5);
          if (dVar5 <= dVar6) {
            dVar4 = dVar4 + (dVar5 / dVar6) * (dVar5 / dVar6);
          }
          else {
            dVar4 = dVar4 * (dVar6 / dVar5) * (dVar6 / dVar5) + 1.0;
            dVar6 = dVar5;
          }
        }
        lVar3 = lVar3 - iVar2;
      } while (-1 < lVar3);
    }
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar6 = dVar6 * dVar4;
  }
  return dVar6;
}

Assistant:

double dnrm2_(int *n, double *x, int *incx)
{
  long int ix, nn, iincx;
  double norm, scale, absxi, ssq, temp;

/*  DNRM2 returns the euclidean norm of a vector via the function   
    name, so that   

       DNRM2 := sqrt( x'*x )   

    -- This version written on 25-October-1982.   
       Modified on 14-October-1993 to inline the call to SLASSQ.   
       Sven Hammarling, Nag Ltd.   */

  /* Dereference inputs */
  nn = *n;
  iincx = *incx;

  if( nn > 0 && iincx > 0 )
  {
    if (nn == 1)
    {
      norm = fabs(x[0]);
    }  
    else
    {
      scale = 0.0;
      ssq = 1.0;

      /* The following loop is equivalent to this call to the LAPACK 
         auxiliary routine:   CALL SLASSQ( N, X, INCX, SCALE, SSQ ) */

      for (ix=(nn-1)*iincx; ix>=0; ix-=iincx)
      {
        if (x[ix] != 0.0)
        {
          absxi = fabs(x[ix]);
          if (scale < absxi)
          {
            temp = scale / absxi;
            ssq = ssq * (temp * temp) + 1.0;
            scale = absxi;
          }
          else
          {
            temp = absxi / scale;
            ssq += temp * temp;
          }
        }
      }
      norm = scale * sqrt(ssq);
    }
  }
  else
    norm = 0.0;

  return norm;

}